

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_insert_seg(REF_CAVITY ref_cavity,REF_INT *nodes)

{
  REF_LIST pRVar1;
  REF_GRID pRVar2;
  REF_NODE pRVar3;
  REF_CELL ref_cell;
  REF_INT *pRVar4;
  REF_ADJ_ITEM pRVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  REF_INT *pRVar9;
  REF_ADJ pRVar10;
  int iVar11;
  int *piVar12;
  undefined8 uVar13;
  REF_STATUS RVar14;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  REF_INT RVar18;
  long lVar19;
  int iVar20;
  REF_INT ntri;
  REF_INT face;
  REF_INT face_nodes [3];
  REF_BOOL reversed;
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  int local_80;
  int local_7c;
  long local_78;
  int local_70;
  int local_6c;
  undefined8 local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  REF_NODE local_48;
  long local_40;
  long local_38;
  
  uVar7 = ref_cavity_find_seg(ref_cavity,nodes,&local_7c,&local_58);
  if ((uVar7 == 0) || (uVar15 = (ulong)uVar7, uVar7 == 5)) {
    lVar8 = (long)local_7c;
    if (lVar8 == -1) {
      iVar20 = ref_cavity->blankseg;
      if (iVar20 == -1) {
        iVar20 = ref_cavity->maxseg;
        iVar11 = 100;
        if (100 < (int)((double)iVar20 * 1.5)) {
          iVar11 = (int)((double)iVar20 * 1.5);
        }
        ref_cavity->maxseg = iVar11 + iVar20;
        fflush(_stdout);
        if (ref_cavity->maxseg < 1) {
          pRVar9 = ref_cavity->s2n;
        }
        else {
          pRVar9 = (REF_INT *)realloc(ref_cavity->s2n,(ulong)(uint)ref_cavity->maxseg * 0xc);
          ref_cavity->s2n = pRVar9;
        }
        if (pRVar9 == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x107,"ref_cavity_insert_seg","realloc ref_cavity->s2n NULL");
          uVar15 = (long)ref_cavity->maxseg * 3;
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar15 & 0xffffffff,
                 uVar15,4,(long)ref_cavity->maxseg * 0xc);
          return 2;
        }
        iVar11 = ref_cavity->maxseg;
        if (iVar20 < iVar11) {
          lVar8 = (long)iVar20;
          piVar12 = pRVar9 + lVar8 * 3 + 1;
          iVar6 = iVar20;
          do {
            iVar6 = iVar6 + 1;
            piVar12[-1] = -1;
            lVar8 = lVar8 + 1;
            *piVar12 = iVar6;
            iVar11 = ref_cavity->maxseg;
            piVar12 = piVar12 + 3;
          } while (lVar8 < iVar11);
        }
        pRVar9[iVar11 * 3 + -2] = -1;
        ref_cavity->blankseg = iVar20;
      }
      else {
        pRVar9 = ref_cavity->s2n;
      }
      lVar8 = (long)(iVar20 * 3);
      ref_cavity->blankseg = pRVar9[lVar8 + 1];
      pRVar9[lVar8] = *nodes;
      pRVar9[lVar8 + 1] = nodes[1];
      pRVar9[lVar8 + 2] = nodes[2];
      ref_cavity->nseg = ref_cavity->nseg + 1;
      if ((ref_cavity->tet_list->n != 0) && (ref_cavity->state == REF_CAVITY_UNKNOWN)) {
        local_60 = ref_cavity->surf_node;
        if (local_60 == -1) {
          local_60 = ref_cavity->node;
        }
        if ((*nodes != local_60) && (nodes[1] != local_60)) {
          local_68 = CONCAT44(nodes[1],*nodes);
          local_7c = iVar20;
          uVar7 = ref_cavity_insert_face(ref_cavity,(REF_INT *)&local_68);
          if (uVar7 != 0) {
            uVar15 = (ulong)uVar7;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xad,"ref_cavity_add_seg_face",(ulong)uVar7,"add face for seg");
            pcVar17 = "add seg face";
            uVar13 = 0x118;
            goto LAB_00153ab7;
          }
        }
      }
    }
    else {
      if (local_58 == 0) {
        return 3;
      }
      pRVar9 = ref_cavity->s2n;
      if (nodes[2] == pRVar9[lVar8 * 3 + 2]) {
        pRVar9[lVar8 * 3] = -1;
        pRVar9[lVar8 * 3 + 1] = ref_cavity->blankseg;
        ref_cavity->blankseg = local_7c;
        ref_cavity->nseg = ref_cavity->nseg + -1;
        pRVar1 = ref_cavity->tet_list;
        if ((pRVar1->n != 0) && (ref_cavity->state == REF_CAVITY_UNKNOWN)) {
          local_68 = *(undefined8 *)nodes;
          local_60 = ref_cavity->surf_node;
          if (local_60 == -1) {
            local_60 = ref_cavity->node;
          }
          uVar7 = ref_cavity_find_face(ref_cavity,(REF_INT *)&local_68,&local_70,&local_80);
          if (uVar7 == 0) {
            lVar8 = (long)local_70;
            if (lVar8 == -1) {
              pcVar17 = "face for a segment missing";
              uVar13 = 0x94;
            }
            else {
              if (local_80 != 0) {
                pRVar9 = ref_cavity->f2n;
                pRVar9[lVar8 * 3] = -1;
                pRVar9[lVar8 * 3 + 1] = ref_cavity->blankface;
                ref_cavity->blankface = local_70;
                ref_cavity->nface = ref_cavity->nface + -1;
                goto LAB_00153a12;
              }
              pcVar17 = "face for a segment removal should be backwards";
              uVar13 = 0x95;
            }
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,uVar13,"ref_cavity_remove_seg_face",pcVar17);
            uVar15 = 1;
          }
          else {
            uVar15 = (ulong)uVar7;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x93,"ref_cavity_remove_seg_face",(ulong)uVar7,"find existing face for segment")
            ;
          }
          pcVar17 = "rm seg face";
          uVar13 = 0xf8;
          goto LAB_00153ab7;
        }
LAB_00153a12:
        pRVar2 = ref_cavity->ref_grid;
        pRVar3 = pRVar2->node;
        ref_cell = pRVar2->cell[8];
        if (((ref_cavity->seg_rm_adds_tet != 0) || (pRVar1->n != 0)) &&
           (ref_cavity->state == REF_CAVITY_UNKNOWN)) {
          uVar7 = ref_cell_list_with2(pRVar2->cell[3],*nodes,nodes[1],2,&local_80,&local_70);
          if (uVar7 == 0) {
            if ((long)local_80 == 2) {
              iVar20 = *nodes;
              if (((-1 < (long)iVar20) && (pRVar10 = ref_cell->ref_adj, iVar20 < pRVar10->nnode)) &&
                 (local_40 = (long)pRVar10->first[iVar20], local_40 != -1)) {
                pRVar5 = pRVar10->item + local_40;
                RVar18 = ref_cell->node_per;
                uVar15 = 0;
                local_48 = pRVar3;
                do {
                  if (0 < RVar18) {
                    lVar8 = (long)pRVar5->ref;
                    local_5c = 0;
                    local_78 = lVar8;
                    do {
                      if (nodes[1] == ref_cell->c2n[ref_cell->size_per * (REF_INT)lVar8 + local_5c])
                      {
                        uVar7 = ref_list_contains(ref_cavity->tet_list,(REF_INT)lVar8,&local_4c);
                        if (uVar7 == 0) {
                          lVar8 = local_78;
                          if (local_4c != 0) goto LAB_00153dd9;
                          RVar18 = (REF_INT)local_78;
                          uVar7 = ref_list_push(ref_cavity->tet_list,RVar18);
                          if (uVar7 == 0) {
                            uVar7 = ref_cell_all_local(ref_cell,local_48,RVar18,&local_50);
                            if (uVar7 == 0) {
                              if (local_50 != 0) {
                                lVar8 = local_78;
                                if (0 < ref_cell->face_per) {
                                  lVar16 = 0;
                                  lVar19 = 0;
                                  do {
                                    pRVar9 = ref_cell->c2n;
                                    iVar20 = ref_cell->size_per;
                                    pRVar4 = ref_cell->f2n;
                                    lVar8 = 0;
                                    do {
                                      *(REF_INT *)((long)&local_68 + lVar8 * 4) =
                                           pRVar9[(long)*(int *)((long)pRVar4 + lVar8 * 4 + lVar16)
                                                  + iVar20 * local_78];
                                      lVar8 = lVar8 + 1;
                                    } while (lVar8 != 3);
                                    local_38 = lVar16;
                                    uVar7 = ref_cell_with(pRVar2->cell[3],(REF_INT *)&local_68,
                                                          &local_54);
                                    if ((uVar7 != 0) && (uVar7 != 5)) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                             ,0xd8,"ref_cavity_remove_seg_add_tets",(ulong)uVar7,
                                             "search for boundary tri");
                                      uVar15 = (ulong)uVar7;
                                    }
                                    if ((uVar7 != 5) && (uVar7 != 0)) {
                                      if ((int)uVar15 != 0) goto LAB_00153fd5;
                                      goto LAB_0015412c;
                                    }
                                    if (((local_54 == -1) ||
                                        ((local_54 != local_70 && (local_54 != local_6c)))) &&
                                       (uVar7 = ref_cavity_insert_face
                                                          (ref_cavity,(REF_INT *)&local_68),
                                       uVar7 != 0)) {
                                      pcVar17 = "tet face rm seg";
                                      uVar13 = 0xdd;
                                      goto LAB_00154114;
                                    }
                                    lVar19 = lVar19 + 1;
                                    lVar16 = local_38 + 0x10;
                                    lVar8 = local_78;
                                  } while (lVar19 < ref_cell->face_per);
                                }
                                goto LAB_00153dd9;
                              }
                              ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
                              goto LAB_0015412c;
                            }
                            pcVar17 = "local cell";
                            uVar13 = 0xcd;
                          }
                          else {
                            pcVar17 = "save tet";
                            uVar13 = 0xcc;
                          }
                        }
                        else {
                          pcVar17 = "have tet?";
                          uVar13 = 0xca;
                        }
LAB_00154114:
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,uVar13,"ref_cavity_remove_seg_add_tets",(ulong)uVar7,pcVar17);
                        uVar15 = (ulong)uVar7;
                        goto LAB_00153fd5;
                      }
LAB_00153dd9:
                      local_5c = local_5c + 1;
                      RVar18 = ref_cell->node_per;
                    } while (local_5c < RVar18);
                    pRVar10 = ref_cell->ref_adj;
                  }
                  local_40 = (long)pRVar10->item[(int)local_40].next;
                  if (local_40 == -1) break;
                  pRVar5 = pRVar10->item + local_40;
                } while( true );
              }
              goto LAB_0015412c;
            }
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xc4,"ref_cavity_remove_seg_add_tets","cavity segment does not have two tri",2,
                   (long)local_80);
            uVar15 = 1;
          }
          else {
            uVar15 = (ulong)uVar7;
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xc3,"ref_cavity_remove_seg_add_tets",(ulong)uVar7,"tri with2");
          }
LAB_00153fd5:
          pcVar17 = "rm seg tets";
          uVar13 = 0xf9;
          goto LAB_00153ab7;
        }
      }
      else {
        ref_cavity->state = REF_CAVITY_BOUNDARY_CONSTRAINED;
      }
    }
LAB_0015412c:
    RVar14 = 0;
  }
  else {
    pcVar17 = "find existing";
    uVar13 = 0xea;
LAB_00153ab7:
    RVar14 = (REF_STATUS)uVar15;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar13
           ,"ref_cavity_insert_seg",uVar15,pcVar17);
  }
  return RVar14;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_insert_seg(REF_CAVITY ref_cavity,
                                         REF_INT *nodes) {
  REF_INT node, seg;
  REF_INT orig, chunk;
  REF_BOOL reversed;

  RXS(ref_cavity_find_seg(ref_cavity, nodes, &seg, &reversed), REF_NOT_FOUND,
      "find existing");

  if (REF_EMPTY != seg) {
    if (reversed) { /* two segs with opposite orientation destroy each other */
      if (nodes[2] != ref_cavity_s2n(ref_cavity, 2, seg)) {
        /* mixing faceid would violate topology */
        ref_cavity_state(ref_cavity) = REF_CAVITY_BOUNDARY_CONSTRAINED;
        return REF_SUCCESS;
      }
      ref_cavity_s2n(ref_cavity, 0, seg) = REF_EMPTY;
      ref_cavity_s2n(ref_cavity, 1, seg) = ref_cavity_blankseg(ref_cavity);
      ref_cavity_blankseg(ref_cavity) = seg;

      ref_cavity_nseg(ref_cavity)--;
      RSS(ref_cavity_remove_seg_face(ref_cavity, nodes), "rm seg face");
      RSS(ref_cavity_remove_seg_add_tets(ref_cavity, nodes), "rm seg tets");

      return REF_SUCCESS;
    } else { /* can't happen, added same seg twice */
      return REF_INVALID;
    }
  }

  /* if I need to grow my array of segs */
  if (REF_EMPTY == ref_cavity_blankseg(ref_cavity)) {
    orig = ref_cavity_maxseg(ref_cavity);
    chunk = MAX(100, (REF_INT)(1.5 * (REF_DBL)orig));
    ref_cavity_maxseg(ref_cavity) = orig + chunk;

    ref_realloc(ref_cavity->s2n, 3 * ref_cavity_maxseg(ref_cavity), REF_INT);

    for (seg = orig; seg < ref_cavity_maxseg(ref_cavity); seg++) {
      ref_cavity_s2n(ref_cavity, 0, seg) = REF_EMPTY;
      ref_cavity_s2n(ref_cavity, 1, seg) = seg + 1;
    }
    ref_cavity_s2n(ref_cavity, 1, (ref_cavity->maxseg) - 1) = REF_EMPTY;
    ref_cavity_blankseg(ref_cavity) = orig;
  }

  seg = ref_cavity_blankseg(ref_cavity);
  ref_cavity_blankseg(ref_cavity) = ref_cavity_s2n(ref_cavity, 1, seg);
  for (node = 0; node < 2; node++)
    ref_cavity_s2n(ref_cavity, node, seg) = nodes[node];
  ref_cavity_s2n(ref_cavity, 2, seg) = nodes[2]; /* faceid */

  ref_cavity_nseg(ref_cavity)++;
  RSS(ref_cavity_add_seg_face(ref_cavity, nodes), "add seg face");

  return REF_SUCCESS;
}